

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManOneHot(int nSkips,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *__ptr;
  Gia_Man_t *p_00;
  char *pcVar4;
  int *pTemp;
  int nLogVars;
  int iGiaLit;
  int Shift;
  int b;
  int i;
  Gia_Man_t *p;
  int nVars_local;
  int nSkips_local;
  
  iVar1 = Abc_Base2Log(nVars);
  __ptr = (int *)calloc((long)(1 << ((byte)iVar1 & 0x1f)),4);
  p_00 = Gia_ManStart(nSkips + nVars * 4 + 1);
  pcVar4 = Abc_UtilStrsav("onehot");
  p_00->pName = pcVar4;
  for (Shift = 0; Shift < nSkips; Shift = Shift + 1) {
    Gia_ManAppendCi(p_00);
  }
  for (Shift = 0; Shift < nVars; Shift = Shift + 1) {
    iVar2 = Gia_ManAppendCi(p_00);
    __ptr[Shift] = iVar2;
  }
  Gia_ManHashStart(p_00);
  for (iGiaLit = 0; iGiaLit < iVar1; iGiaLit = iGiaLit + 1) {
    iVar2 = 1 << ((byte)iGiaLit & 0x1f);
    for (Shift = 0; Shift < 1 << ((byte)iVar1 & 0x1f); Shift = iVar2 * 2 + Shift) {
      iVar3 = Gia_ManHashAnd(p_00,__ptr[Shift],__ptr[Shift + iVar2]);
      if (iVar3 != 0) {
        Gia_ManAppendCo(p_00,iVar3);
      }
      iVar3 = Gia_ManHashOr(p_00,__ptr[Shift],__ptr[Shift + iVar2]);
      __ptr[Shift] = iVar3;
    }
  }
  Gia_ManHashStop(p_00);
  iVar1 = Abc_LitNot(*__ptr);
  Gia_ManAppendCo(p_00,iVar1);
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  iVar1 = Gia_ManObjNum(p_00);
  if (nSkips + nVars * 4 + 1 < iVar1) {
    __assert_fail("Gia_ManObjNum(p) <= nSkips + 4 * nVars + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xe47,"Gia_Man_t *Gia_ManOneHot(int, int)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManOneHot( int nSkips, int nVars )
{
    Gia_Man_t * p;
    int i, b, Shift, iGiaLit, nLogVars = Abc_Base2Log( nVars );
    int * pTemp = ABC_CALLOC( int, (1 << nLogVars) );
    p = Gia_ManStart( nSkips + 4 * nVars + 1 );
    p->pName = Abc_UtilStrsav( "onehot" );
    for ( i = 0; i < nSkips; i++ )
        Gia_ManAppendCi( p );
    for ( i = 0; i < nVars; i++ )
        pTemp[i] = Gia_ManAppendCi( p );
    Gia_ManHashStart( p );
    for ( b = 0; b < nLogVars; b++ )
        for ( i = 0, Shift = (1<<b); i < (1 << nLogVars); i += 2*Shift )
        {
            iGiaLit = Gia_ManHashAnd( p, pTemp[i], pTemp[i + Shift] );
            if ( iGiaLit )
                Gia_ManAppendCo( p, iGiaLit );
            pTemp[i] = Gia_ManHashOr( p, pTemp[i], pTemp[i + Shift] );
        }
    Gia_ManHashStop( p );
    Gia_ManAppendCo( p, Abc_LitNot(pTemp[0]) );
    ABC_FREE( pTemp );
    assert( Gia_ManObjNum(p) <= nSkips + 4 * nVars + 1 );
    return p;
}